

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int encode_with_recode_loop_and_filter
              (AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,int64_t *sse,int64_t *rate,
              int *largest_tile_id)

{
  AV1_COMMON *pAVar1;
  YV12_BUFFER_CONFIG *scaled;
  CommonQuantParams *quant_params;
  segmentation *psVar2;
  MACROBLOCKD *xd;
  int32_t *piVar3;
  BLOCK_SIZE BVar4;
  AQ_MODE AVar5;
  char cVar6;
  RECODE_LOOP_TYPE RVar7;
  uint8_t uVar8;
  AV1_PRIMARY *pAVar9;
  RefCntBuffer *pRVar10;
  AV1LevelInfo *pAVar11;
  LAYER_CONTEXT *pLVar12;
  byte bVar13;
  aom_transfer_characteristics_t aVar14;
  int64_t *piVar15;
  long *plVar16;
  DECODER_MODEL_STATUS DVar17;
  uint16_t uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  PixelLevelGradientInfo *pPVar23;
  Block4x4VarInfo *pBVar24;
  VP64x64 *pVVar25;
  YV12_BUFFER_CONFIG *pYVar26;
  SequenceHeader *pSVar27;
  AV1_PRIMARY *pAVar28;
  RefCntBuffer *pRVar29;
  uint8_t *memblk;
  int64_t iVar30;
  uint uVar31;
  int *piVar32;
  int16_t (*paiVar33) [8];
  int16_t (*paiVar34) [8];
  uint uVar35;
  long lVar36;
  InterpFilter filter;
  bool bVar37;
  undefined4 uVar38;
  undefined8 unaff_RBP;
  size_t *psVar39;
  ulong uVar41;
  int iVar42;
  size_t sVar43;
  long lVar44;
  RestorationInfo *pRVar45;
  undefined8 unaff_R15;
  SequenceHeader *pSVar46;
  bool bVar47;
  bool bVar48;
  byte bVar49;
  int iVar52;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  uint local_174;
  SequenceHeader *local_170;
  AV1_COMMON *local_168;
  uint local_15c;
  int top_index;
  int overshoot_seen;
  int bottom_index_1;
  uint local_14c;
  int undershoot_seen;
  int local_144;
  AV1_COMMON *local_140;
  size_t *local_138;
  int bottom_index;
  int64_t *local_128;
  long *local_120;
  uint8_t *local_118;
  size_t local_110;
  int16_t (*local_108) [8];
  MV_STATS *local_100;
  YV12_BUFFER_CONFIG *local_f8;
  segmentation *local_f0;
  CommonQuantParams *local_e8;
  EncQuantDequantParams *local_e0;
  YV12_BUFFER_CONFIG *local_d8;
  int frame_over_shoot_limit;
  undefined4 uStack_cc;
  uint64_t local_b0;
  undefined7 uVar40;
  
  cpi->do_update_vbr_bits_off_target_fast = 0;
  local_138 = size;
  local_118 = dest;
  local_110 = dest_size;
  memset(cpi->do_update_frame_probs_txtype,0,0xa0);
  local_128 = sse;
  local_120 = rate;
  if ((cpi->sf).hl_sf.recode_loop != '\0') {
    lVar22 = 0x41f08;
    do {
      piVar3 = (int32_t *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[0] + lVar22);
      piVar3[0] = 0;
      piVar3[1] = 0x10000;
      *(undefined8 *)(piVar3 + 2) = 0;
      piVar3 = (int32_t *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar22);
      piVar3[0] = 0;
      piVar3[1] = 0;
      piVar3[2] = 0x10000;
      piVar3[3] = 0;
      *(undefined4 *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[1] + lVar22) = 0;
      lVar22 = lVar22 + 0x24;
    } while (lVar22 != 0x42004);
    (cpi->gm_info).search_done = false;
    av1_set_speed_features_framesize_independent(cpi,cpi->speed);
    av1_set_rd_speed_thresholds(cpi);
    (cpi->common).features.interp_filter = MULTITAP_SHARP2;
    (cpi->common).features.switchable_motion_mode =
         (bool)((cpi->oxcf).motion_mode_cfg.enable_obmc | (cpi->common).features.allow_warped_motion
               );
    if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) &&
       ((cpi->sf).interp_sf.adaptive_interp_filter_search != 0)) {
      uVar18 = av1_setup_interp_filter_search_mask(cpi);
      (cpi->interp_search_flags).interp_filter_search_mask = uVar18;
    }
    av1_setup_frame_size(cpi);
    iVar19 = av1_superres_in_recode_allowed(cpi);
    if (((iVar19 != 0) && (cpi->superres_mode != AOM_SUPERRES_NONE)) &&
       ((cpi->common).superres_scale_denominator == '\b')) {
      if (sse != (int64_t *)0x0) {
        *sse = 0x7fffffffffffffff;
      }
      if (rate != (int64_t *)0x0) {
        *rate = 0x7fffffffffffffff;
      }
      *largest_tile_id = 0;
      return 0;
    }
    top_index = 0;
    bottom_index = 0;
    local_174 = 0;
    av1_set_size_dependent_vars(cpi,(int *)&local_174,&bottom_index,&top_index);
    pSVar46 = (SequenceHeader *)(ulong)(uint)bottom_index;
    local_170 = (SequenceHeader *)(ulong)(uint)top_index;
    av1_set_mv_search_params(cpi);
    if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) &&
        ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
       (((cpi->sf).part_sf.partition_search_type == '\0' &&
        (((cpi->sf).intra_sf.intra_pruning_with_hog != 0 ||
         ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))))) {
      pPVar23 = (cpi->td).pixel_gradient_info;
      if (pPVar23 == (PixelLevelGradientInfo *)0x0) {
        pPVar23 = (PixelLevelGradientInfo *)
                  aom_malloc((ulong)(uint)((int)(2L >> (((cpi->common).seq_params)->monochrome &
                                                       0x3f)) << 0x10));
        if (pPVar23 == (PixelLevelGradientInfo *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pixel_gradient_info");
        }
        (cpi->td).pixel_gradient_info = pPVar23;
      }
      (cpi->td).mb.pixel_gradient_info = pPVar23;
    }
    if (((cpi->oxcf).mode == '\x02') &&
       (((cpi->sf).part_sf.partition_search_type == '\0' ||
        ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
         (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0))
         )))))) {
      pBVar24 = (cpi->td).src_var_info_of_4x4_sub_blocks;
      if (pBVar24 == (Block4x4VarInfo *)0x0) {
        BVar4 = ((cpi->common).seq_params)->sb_size;
        pBVar24 = (Block4x4VarInfo *)
                  aom_malloc((ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                           [BVar4] *
                                     (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                           [BVar4] * 0x10));
        if (pBVar24 == (Block4x4VarInfo *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate source_variance_info");
        }
        (cpi->td).src_var_info_of_4x4_sub_blocks = pBVar24;
      }
      (cpi->td).mb.src_var_info_of_4x4_sub_blocks = pBVar24;
    }
    if ((cpi->sf).part_sf.partition_search_type == '\x02') {
      BVar4 = ((cpi->common).seq_params)->sb_size;
      iVar19 = (uint)(BVar4 != BLOCK_64X64) * 3 + 1;
      pVVar25 = (cpi->td).vt64x64;
      if (pVVar25 != (VP64x64 *)0x0) {
        if (iVar19 == (cpi->td).num_64x64_blocks) goto LAB_001c28c2;
        aom_free(pVVar25);
        (cpi->td).vt64x64 = (VP64x64 *)0x0;
      }
      sVar43 = 0x2aa40;
      if (BVar4 == BLOCK_64X64) {
        sVar43 = 0xaa90;
      }
      pVVar25 = (VP64x64 *)aom_malloc(sVar43);
      (cpi->td).vt64x64 = pVVar25;
      if (pVVar25 == (VP64x64 *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->td.vt64x64");
      }
      (cpi->td).num_64x64_blocks = iVar19;
    }
LAB_001c28c2:
    if ((cpi->common).current_frame.frame_type == '\0') {
      pAVar9 = cpi->ppi;
      if ((cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats != 0) {
        memcpy((pAVar9->frame_probs).tx_type_probs,default_tx_type_probs,0x2140);
      }
      if (0x80000001 < (cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U) {
        memcpy(&pAVar9->frame_probs,default_obmc_probs,0x268);
      }
      if (0 < (cpi->sf).inter_sf.prune_warped_prob_thresh) {
        (pAVar9->frame_probs).warped_probs[3] = 0x40;
        (pAVar9->frame_probs).warped_probs[4] = 0x40;
        (pAVar9->frame_probs).warped_probs[5] = 0x40;
        (pAVar9->frame_probs).warped_probs[6] = 0x40;
        (pAVar9->frame_probs).warped_probs[0] = 0x40;
        (pAVar9->frame_probs).warped_probs[1] = 0x40;
        (pAVar9->frame_probs).warped_probs[2] = 0x40;
        (pAVar9->frame_probs).warped_probs[3] = 0x40;
      }
      if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
        memcpy((pAVar9->frame_probs).switchable_interp_probs,default_switchable_interp_probs,0x540);
      }
    }
    if (((cpi->sf).hl_sf.disable_extra_sc_testing == 0) && (cpi->use_ducky_encode == 0)) {
      av1_determine_sc_tools_with_encoding(cpi,local_174);
    }
    cpi->num_frame_recode = 0;
    overshoot_seen = 0;
    undershoot_seen = 0;
    local_d8 = &cpi->scaled_source;
    local_f8 = &cpi->scaled_last_source;
    local_e0 = &cpi->enc_quant_dequant_params;
    local_e8 = &(cpi->common).quant_params;
    local_f0 = &(cpi->common).seg;
    local_108 = (cpi->common).seg.feature_data;
    local_100 = &cpi->mv_stats;
    local_144 = 0;
    iVar19 = 0;
    psVar39 = local_138;
    uVar20 = 0;
    local_140 = &cpi->common;
    do {
      psVar2 = local_f0;
      pAVar1 = local_140;
      local_168 = (AV1_COMMON *)CONCAT44(local_168._4_4_,iVar19);
      if ((((iVar19 != 0) && (pYVar26 = cpi->source, pYVar26 != (YV12_BUFFER_CONFIG *)0x0)) &&
          ((cpi->gm_info).search_done == true)) &&
         (((pYVar26->field_2).field_0.y_crop_width != (cpi->common).width ||
          ((pYVar26->field_3).field_0.y_crop_height != (cpi->common).height)))) {
        (cpi->gm_info).search_done = false;
      }
      pYVar26 = av1_realloc_and_scale_if_required
                          (local_140,cpi->unscaled_source,local_d8,EIGHTTAP_REGULAR,0,false,false,
                           (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->source = pYVar26;
      if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
        pYVar26 = av1_realloc_and_scale_if_required
                            (pAVar1,cpi->unscaled_last_source,local_f8,EIGHTTAP_REGULAR,0,false,
                             false,(cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
        cpi->last_source = pYVar26;
      }
      pAVar9 = cpi->ppi;
      if (((pAVar9->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
         (((pAVar1->current_frame).frame_type & 0xfd) != 0)) {
        if ((uint)local_168 != 0) {
          bVar48 = (cpi->refresh_frame).golden_frame;
          bVar49 = 1;
          lVar22 = 0;
          do {
            pRVar29 = cpi->scaled_ref_buf[lVar22];
            if (lVar22 == 3) {
              if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar9->lap_enabled == 0)) &&
                  ((cpi->oxcf).mode == '\x01')) &&
                 ((((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (pAVar9->use_svc == 0)) &&
                  (pRVar29 != (RefCntBuffer *)0x0)))) {
                pRVar10 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                if ((pRVar29->buf).field_2.field_0.y_crop_width ==
                    (pRVar10->buf).field_2.field_0.y_crop_width) {
                  bVar37 = (pRVar29->buf).field_3.field_0.y_crop_height ==
                           (pRVar10->buf).field_3.field_0.y_crop_height;
                }
                else {
                  bVar37 = false;
                }
                bVar13 = 1;
                if ((bVar48 != false) || (bVar37)) {
LAB_001c2b68:
                  pRVar29->ref_count = pRVar29->ref_count + -1;
                  cpi->scaled_ref_buf[lVar22] = (RefCntBuffer *)0x0;
                  bVar49 = bVar13;
                }
                else {
                  bVar49 = 0;
                }
              }
              else {
                bVar13 = 1;
                if (!(bool)(~bVar49 & 1 | pRVar29 == (RefCntBuffer *)0x0)) goto LAB_001c2b68;
                bVar49 = pRVar29 == (RefCntBuffer *)0x0 & bVar49;
              }
            }
            else {
              bVar13 = bVar49;
              if (pRVar29 != (RefCntBuffer *)0x0) goto LAB_001c2b68;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 7);
        }
        av1_scale_references(cpi,EIGHTTAP_REGULAR,0,0);
      }
      if ((cpi->use_ducky_encode != 0) && ((cpi->ducky_encode_info).frame_info.qp_mode == '\x01')) {
        local_174 = (cpi->ducky_encode_info).frame_info.q_index;
        (cpi->common).delta_q_info.delta_q_present_flag =
             (cpi->ducky_encode_info).frame_info.delta_q_enabled;
      }
      av1_set_quantizer(pAVar1,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,local_174
                        ,(uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                        (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                        (cpi->oxcf).tune_cfg.tuning);
      av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
      av1_init_quantizer(local_e0,local_e8,((cpi->common).seq_params)->bit_depth,
                         (cpi->oxcf).algo_cfg.sharpness);
      av1_set_variance_partition_thresholds(cpi,local_174,0);
      if ((uint)local_168 == 0) {
        av1_setup_frame(cpi);
      }
      else {
        uVar31 = (cpi->common).features.primary_ref_frame;
        if ((((uVar31 & 0xf8) != 0 || uVar31 == 7) ||
            (lVar22 = (long)(cpi->common).remapped_ref_idx[uVar31 & 7], lVar22 == -1)) ||
           ((cpi->common).ref_frame_map[lVar22] == (RefCntBuffer *)0x0)) {
          av1_default_coef_probs(pAVar1);
          av1_setup_frame_contexts(pAVar1);
        }
      }
      AVar5 = (cpi->oxcf).q_cfg.aq_mode;
      if (AVar5 == '\x02') {
        av1_setup_in_frame_q_adj(cpi);
      }
      else if (AVar5 == '\x01') {
        av1_vaq_frame_setup(cpi);
      }
      if (psVar2->enabled == '\0') {
        memset(psVar2,0,0xac);
      }
      else if (((cpi->common).seg.update_data == '\0') &&
              (pRVar29 = (cpi->common).prev_frame, pRVar29 != (RefCntBuffer *)0x0)) {
        paiVar33 = (pRVar29->seg).feature_data;
        lVar22 = 0;
        paiVar34 = local_108;
        do {
          (cpi->common).seg.feature_mask[lVar22] = (pRVar29->seg).feature_mask[lVar22];
          lVar44 = 0;
          do {
            (*paiVar34)[lVar44] = (*paiVar33)[lVar44];
            lVar44 = lVar44 + 1;
          } while (lVar44 != 8);
          lVar22 = lVar22 + 1;
          paiVar34 = paiVar34 + 1;
          paiVar33 = paiVar33 + 1;
        } while (lVar22 != 8);
        (cpi->common).seg.segid_preskip = (pRVar29->seg).segid_preskip;
        (cpi->common).seg.last_active_segid = (pRVar29->seg).last_active_segid;
        (cpi->common).seg.enabled = (pRVar29->seg).enabled;
      }
      else {
        av1_calculate_segdata(psVar2);
      }
      pRVar29 = (cpi->common).cur_frame;
      paiVar33 = (pRVar29->seg).feature_data;
      lVar22 = 0;
      paiVar34 = local_108;
      do {
        (pRVar29->seg).feature_mask[lVar22] = (cpi->common).seg.feature_mask[lVar22];
        lVar44 = 0;
        do {
          (*paiVar33)[lVar44] = (*paiVar34)[lVar44];
          lVar44 = lVar44 + 1;
        } while (lVar44 != 8);
        lVar22 = lVar22 + 1;
        paiVar33 = paiVar33 + 1;
        paiVar34 = paiVar34 + 1;
      } while (lVar22 != 8);
      (pRVar29->seg).segid_preskip = (cpi->common).seg.segid_preskip;
      (pRVar29->seg).last_active_segid = (cpi->common).seg.last_active_segid;
      (pRVar29->seg).enabled = (cpi->common).seg.enabled;
      uVar31 = uVar20;
      if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
        av1_pick_and_set_high_precision_mv(cpi,local_174);
        uVar31 = (uint)(cpi->common).features.allow_high_precision_mv;
        if (((uint)local_168 != 0) && (uVar20 != uVar31)) {
          (cpi->gm_info).search_done = false;
        }
      }
      local_14c = uVar31;
      av1_encode_frame(cpi);
      bVar48 = cpi->do_frame_data_update;
      if ((cpi->mv_stats).valid != 0 && bVar48 == true) {
        local_100->horz_text = 0;
        local_100->vert_text = 0;
        local_100->diag_text = 0;
        local_100->valid = 0;
        local_100->total_mv_rate = 0;
        local_100->hp_total_mv_rate = 0;
        local_100->lp_total_mv_rate = 0;
        local_100->horz_text = 0;
        local_100->mv_joint_count[2] = 0;
        local_100->mv_joint_count[3] = 0;
        local_100->last_bit_zero = 0;
        local_100->last_bit_nonzero = 0;
        local_100->intra_count = 0;
        local_100->default_mvs = 0;
        local_100->mv_joint_count[0] = 0;
        local_100->mv_joint_count[1] = 0;
        local_100->high_prec = 0;
        local_100->q = 0;
        local_100->order = 0;
        local_100->inter_count = 0;
      }
      if (((cpi->sf).hl_sf.high_precision_mv_usage == '\0') &&
         ((((cpi->common).current_frame.frame_type & 0xfd) != 0 & bVar48 &
          ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 4) == 1)) {
        av1_collect_mv_stats(cpi,local_174);
      }
      if ((((cpi->sf).hl_sf.recode_loop != '\0') && ((cpi->oxcf).rc_cfg.mode != AOM_Q)) ||
         ((cpi->oxcf).rc_cfg.min_cr != 0)) {
        av1_finalize_encoded_frame(cpi);
        frame_over_shoot_limit = 0;
        (cpi->rc).coefficient_size = 0;
        iVar19 = av1_pack_bitstream(cpi,local_118,local_110,psVar39,&frame_over_shoot_limit);
        if (iVar19 != 0) {
          return 1;
        }
        (cpi->rc).projected_frame_size = (int)*psVar39 << 3;
      }
      iVar52 = bottom_index;
      iVar19 = top_index;
      pAVar9 = cpi->ppi;
      if (((cpi->rc).is_src_frame_alt_ref != 0) &&
         ((cpi->rc).projected_frame_size < (cpi->rc).max_frame_bandwidth)) goto LAB_001c4644;
      uVar20 = (cpi->oxcf).rc_cfg.min_cr;
      iVar21 = (int)pSVar46;
      if ((int)uVar20 < 1) {
LAB_001c3086:
        if ((((pAVar9->level_params).keep_level_stats != 0) &&
            ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) && (cpi->compressor_stage != '\x01')) {
          pAVar28 = pAVar9;
          if (((local_140->current_frame).frame_type == '\0') &&
             ((pAVar9->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
            av1_init_level_info(cpi);
            pAVar28 = cpi->ppi;
          }
          uVar41 = (ulong)(pAVar28->level_params).target_seq_level_idx[0];
          if ((((uVar41 < 0x1c) &&
               (pAVar11 = (pAVar28->level_params).level_info[0],
               pAVar11->decoder_models[uVar41].status == '\0')) &&
              (DVar17 = av1_decoder_model_try_smooth_buf
                                  (cpi,(long)(cpi->rc).projected_frame_size,
                                   pAVar11->decoder_models + uVar41), (byte)(DVar17 - 5) < 2)) &&
             (uVar20 = (cpi->rc).worst_quality, (int)local_174 < (int)uVar20)) {
            local_174 = local_174 + 10;
            if ((int)uVar20 <= (int)local_174) {
              local_174 = uVar20;
            }
            if (iVar21 < (int)local_174) {
              pSVar46 = (SequenceHeader *)(ulong)local_174;
            }
            pSVar27 = (SequenceHeader *)(ulong)local_174;
            if ((int)local_174 <= (int)local_170) {
              pSVar27 = (SequenceHeader *)((ulong)local_170 & 0xffffffff);
            }
            goto LAB_001c3069;
          }
        }
        if ((cpi->oxcf).rc_cfg.mode == AOM_Q) goto LAB_001c4644;
        local_15c = local_174;
        frame_over_shoot_limit = 0;
        bottom_index_1 = 0;
        av1_rc_compute_frame_size_bounds
                  (cpi,(cpi->rc).this_frame_target,&bottom_index_1,&frame_over_shoot_limit);
        pSVar27 = local_170;
        if (frame_over_shoot_limit == 0) {
          frame_over_shoot_limit = 1;
        }
        bVar49 = (local_140->current_frame).frame_type;
        uVar20 = (uint)local_170;
        if (bVar49 == 0) {
          iVar58 = (cpi->rc).projected_frame_size;
          iVar42 = (cpi->rc).max_frame_bandwidth;
          if (iVar42 <= iVar58 || (pAVar9->p_rc).this_key_frame_forced == 0) goto LAB_001c3228;
          lVar22 = cpi->ambient_err;
          pYVar26 = &((cpi->common).cur_frame)->buf;
          if (((cpi->common).seq_params)->use_highbitdepth == '\0') {
            lVar44 = aom_get_y_sse(cpi->source,pYVar26);
          }
          else {
            lVar44 = aom_highbd_get_y_sse(cpi->source,pYVar26);
          }
          lVar44 = lVar44 + (ulong)(lVar44 == 0);
          if (((lVar22 < lVar44) && ((cpi->rc).projected_frame_size <= frame_over_shoot_limit)) ||
             ((lVar36 = lVar22 >> 1, lVar36 < lVar44 &&
              ((cpi->rc).projected_frame_size <= bottom_index_1)))) {
            pSVar27 = (SequenceHeader *)(ulong)(local_174 - 1);
            if ((int)(local_174 - 1) <= iVar21) {
              pSVar27 = pSVar46;
            }
            uVar31 = (uint)((lVar22 * (int)local_174) / lVar44);
            iVar21 = (int)pSVar27 + iVar21;
LAB_001c3467:
            uVar35 = iVar21 >> 1;
            if ((int)uVar31 <= iVar21 >> 1) {
              uVar35 = uVar31;
            }
          }
          else {
            uVar35 = local_174;
            if ((lVar44 < lVar36) && (bottom_index_1 <= (cpi->rc).projected_frame_size)) {
              pSVar46 = (SequenceHeader *)(ulong)(local_174 + 1);
              if ((int)uVar20 <= (int)(local_174 + 1)) {
                pSVar46 = (SequenceHeader *)((ulong)pSVar27 & 0xffffffff);
              }
              uVar31 = (uint)((lVar36 * (int)local_174) / lVar44);
              iVar21 = uVar20 + (int)pSVar46 + 1;
              goto LAB_001c3467;
            }
          }
LAB_001c3653:
          local_174 = (uint)pSVar27;
          if ((int)uVar35 < (int)(uint)pSVar27) {
            local_174 = uVar35;
          }
          local_170 = pSVar27;
          if ((int)uVar35 < (int)(uint)pSVar46) {
            local_174 = (uint)pSVar46;
          }
        }
        else {
          iVar58 = (cpi->rc).projected_frame_size;
          iVar42 = (cpi->rc).max_frame_bandwidth;
LAB_001c3228:
          uVar31 = iVar19;
          if (iVar19 < (int)uVar20) {
            uVar31 = uVar20;
          }
          if (iVar58 < iVar42) {
            RVar7 = (cpi->sf).hl_sf.recode_loop;
            psVar39 = local_138;
            if ((RVar7 == '\x02') ||
               (RVar7 == '\x01' &&
                ((bVar49 & 0xfd) == 0 ||
                ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) == 2)))
            goto LAB_001c3295;
          }
          else {
LAB_001c3295:
            if ((((frame_over_shoot_limit < iVar58) && ((int)local_174 < (int)uVar31)) ||
                (iVar58 < bottom_index_1 && iVar52 < (int)local_174)) ||
               ((((cpi->oxcf).rc_cfg.mode == AOM_CQ &&
                 ((cpi->oxcf).rc_cfg.cq_level < (int)local_174)) &&
                ((long)iVar58 < (long)(cpi->rc).this_frame_target * 7 >> 3)))) {
              if ((cpi->rc).this_frame_target < iVar58) {
                if ((iVar42 <= iVar58) && (local_174 == uVar20)) {
                  dVar53 = av1_convert_qindex_to_q(uVar20,((cpi->common).seq_params)->bit_depth);
                  uVar20 = av1_find_qindex(dVar53 * ((double)(cpi->rc).projected_frame_size /
                                                    (double)(cpi->rc).max_frame_bandwidth),
                                           ((cpi->common).seq_params)->bit_depth,
                                           (cpi->rc).best_quality,(cpi->rc).worst_quality);
                  pSVar27 = (SequenceHeader *)(ulong)uVar20;
                }
                iVar21 = (int)pSVar27;
                pSVar46 = (SequenceHeader *)(ulong)(local_174 + 1);
                if (iVar21 <= (int)(local_174 + 1)) {
                  pSVar46 = (SequenceHeader *)((ulong)pSVar27 & 0xffffffff);
                }
                iVar58 = (int)pSVar46;
                if (((uint)local_168 < 3) && (undershoot_seen == 0)) {
                  if ((uint)local_168 == 2) {
                    if (((local_140->current_frame).frame_type & 0xfd) != 0) goto LAB_001c34ab;
                    av1_rc_update_rate_correction_factors
                              (cpi,1,(cpi->common).width,(cpi->common).height);
                    if (iVar19 < iVar21) {
                      iVar19 = iVar21;
                    }
                    local_170 = pSVar27;
                    iVar21 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                               (cpi->common).width,(cpi->common).height);
                    if (iVar21 < iVar58) {
                      uVar20 = 0;
                      do {
                        av1_rc_update_rate_correction_factors
                                  (cpi,1,(cpi->common).width,(cpi->common).height);
                        iVar21 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                                   (cpi->common).width,(cpi->common).height);
                        if (iVar58 <= iVar21) break;
                        bVar48 = uVar20 < 9;
                        uVar20 = uVar20 + 1;
                      } while (bVar48);
                    }
                    iVar19 = (((int)local_170 + iVar58) - ((int)local_170 + iVar58 + 1 >> 0x1f)) + 1
                             >> 1;
                    iVar19 = (iVar19 + iVar21) - (iVar21 + iVar19 + 1 >> 0x1f);
                    goto LAB_001c34d5;
                  }
                  av1_rc_update_rate_correction_factors
                            (cpi,1,(cpi->common).width,(cpi->common).height);
                  if (iVar19 < iVar21) {
                    iVar19 = iVar21;
                  }
                  uVar35 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                             (cpi->common).width,(cpi->common).height);
                  if ((int)uVar35 < iVar58) {
                    uVar20 = 0;
                    local_170 = pSVar27;
                    do {
                      av1_rc_update_rate_correction_factors
                                (cpi,1,(cpi->common).width,(cpi->common).height);
                      uVar35 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                                 (cpi->common).width,(cpi->common).height);
                      if (iVar58 <= (int)uVar35) break;
                      bVar48 = uVar20 < 9;
                      uVar20 = uVar20 + 1;
                    } while (bVar48);
                    piVar32 = &overshoot_seen;
                    pSVar27 = local_170;
                    goto LAB_001c364d;
                  }
                }
                else {
LAB_001c34ab:
                  av1_rc_update_rate_correction_factors
                            (cpi,1,(cpi->common).width,(cpi->common).height);
                  iVar19 = (iVar21 + iVar58) - (iVar21 + iVar58 + 1 >> 0x1f);
                  local_170 = pSVar27;
LAB_001c34d5:
                  uVar35 = iVar19 + 1 >> 1;
                  pSVar27 = local_170;
                }
                piVar32 = &overshoot_seen;
              }
              else {
                pSVar27 = (SequenceHeader *)(ulong)(local_174 - 1);
                if ((int)(local_174 - 1) <= iVar21) {
                  pSVar27 = pSVar46;
                }
                iVar58 = (int)pSVar27;
                if (((uint)local_168 < 3) && (overshoot_seen == 0)) {
                  if ((uint)local_168 == 2) {
                    if ((bVar49 & 0xfd) != 0) goto LAB_001c3357;
                    local_170 = pSVar46;
                    av1_rc_update_rate_correction_factors
                              (cpi,1,(cpi->common).width,(cpi->common).height);
                    iVar21 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                               (cpi->common).width,(cpi->common).height);
                    if (iVar58 < iVar21) {
                      uVar20 = 0;
                      do {
                        av1_rc_update_rate_correction_factors
                                  (cpi,1,(cpi->common).width,(cpi->common).height);
                        iVar21 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                                   (cpi->common).width,(cpi->common).height);
                        if (iVar21 <= iVar58) break;
                        bVar48 = uVar20 < 9;
                        uVar20 = uVar20 + 1;
                      } while (bVar48);
                    }
                    uVar20 = (uint)local_170;
                    uVar35 = ((int)(iVar58 + uVar20) / 2 + iVar21) / 2;
                    uVar31 = uVar20;
                    if (iVar21 < (int)uVar20) {
                      uVar31 = uVar35;
                    }
                    if ((cpi->oxcf).rc_cfg.mode != AOM_CQ) {
                      uVar31 = uVar20;
                    }
                    pSVar46 = (SequenceHeader *)(ulong)uVar31;
                    goto LAB_001c337d;
                  }
                  local_170 = pSVar46;
                  av1_rc_update_rate_correction_factors
                            (cpi,1,(cpi->common).width,(cpi->common).height);
                  uVar35 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                             (cpi->common).width,(cpi->common).height);
                  if (iVar58 < (int)uVar35) {
                    uVar20 = 0;
                    do {
                      av1_rc_update_rate_correction_factors
                                (cpi,1,(cpi->common).width,(cpi->common).height);
                      uVar35 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,iVar52,iVar19,
                                                 (cpi->common).width,(cpi->common).height);
                      if ((int)uVar35 <= iVar58) break;
                      bVar48 = uVar20 < 9;
                      uVar20 = uVar20 + 1;
                    } while (bVar48);
                  }
                  uVar31 = (uint)local_170;
                  uVar20 = uVar31;
                  if ((int)uVar35 < (int)uVar31) {
                    uVar20 = uVar35;
                  }
                  if ((cpi->oxcf).rc_cfg.mode != AOM_CQ) {
                    uVar20 = uVar31;
                  }
                  pSVar46 = (SequenceHeader *)(ulong)uVar20;
                  piVar32 = &undershoot_seen;
                }
                else {
LAB_001c3357:
                  av1_rc_update_rate_correction_factors
                            (cpi,1,(cpi->common).width,(cpi->common).height);
                  uVar35 = (iVar58 + iVar21) / 2;
LAB_001c337d:
                  piVar32 = &undershoot_seen;
                }
              }
LAB_001c364d:
              *piVar32 = 1;
              goto LAB_001c3653;
            }
          }
        }
        bVar48 = local_174 == local_15c;
      }
      else {
        uVar31 = (cpi->rc).projected_frame_size >> 3;
        cVar6 = ((cpi->common).seq_params)->profile;
        lVar22 = 0x24;
        if (cVar6 == '\x01') {
          lVar22 = 0x1e;
        }
        if (cVar6 == '\0') {
          lVar22 = 0xf;
        }
        iVar58 = uVar31 - 0x80;
        if (uVar31 < 0x82) {
          iVar58 = 1;
        }
        auVar50._0_8_ =
             (double)((long)(cpi->common).height * (long)(cpi->common).superres_upscaled_width *
                      lVar22 >> 3);
        auVar57._8_4_ = iVar58 >> 0x1f;
        auVar57._0_8_ = (long)iVar58;
        auVar57._12_4_ = 0x45300000;
        auVar55._0_8_ =
             (auVar57._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar58) - 4503599627370496.0);
        auVar55._8_8_ = 0x4059000000000000;
        auVar50._8_8_ = (double)(int)uVar20;
        auVar50 = divpd(auVar50,auVar55);
        if (auVar50._8_8_ <= auVar50._0_8_) {
          bVar48 = local_144 == 0;
          local_144 = 0;
          if (bVar48) goto LAB_001c3086;
          goto LAB_001c4644;
        }
        uVar20 = (cpi->rc).worst_quality;
        if ((int)uVar20 <= (int)local_174) goto LAB_001c4644;
        dVar53 = auVar50._8_8_ / auVar50._0_8_;
        uVar35 = (uint)((double)(int)local_174 * dVar53 * dVar53);
        uVar31 = local_174 + 1;
        if ((int)local_174 < (int)uVar35) {
          uVar31 = uVar35;
        }
        uVar35 = local_174 + 0x20;
        if ((int)uVar31 < (int)(local_174 + 0x20)) {
          uVar35 = uVar31;
        }
        local_174 = uVar35;
        if ((int)uVar20 <= (int)uVar35) {
          local_174 = uVar20;
        }
        if (iVar21 < (int)local_174) {
          pSVar46 = (SequenceHeader *)(ulong)local_174;
        }
        pSVar27 = (SequenceHeader *)(ulong)local_174;
        if ((int)local_174 <= (int)local_170) {
          pSVar27 = (SequenceHeader *)((ulong)local_170 & 0xffffffff);
        }
        local_144 = 1;
LAB_001c3069:
        bVar48 = false;
        local_170 = pSVar27;
      }
      if ((cpi->use_ducky_encode != 0) || (bVar48)) goto LAB_001c4644;
      iVar19 = (uint)local_168 + 1;
      iVar52 = cpi->num_frame_recode + 1;
      if (8 < cpi->num_frame_recode) {
        iVar52 = 9;
      }
      cpi->num_frame_recode = iVar52;
      uVar20 = local_14c;
    } while( true );
  }
  iVar19 = (cpi->resize_pending_params).width;
  iVar52 = 0;
  if ((iVar19 == 0) || (iVar21 = (cpi->resize_pending_params).height, iVar21 == 0)) {
    uVar38 = 0;
  }
  else {
    uVar40 = (undefined7)((ulong)unaff_RBP >> 8);
    uVar38 = (undefined4)CONCAT71(uVar40,1);
    if ((cpi->common).width == iVar19) {
      uVar38 = (undefined4)CONCAT71(uVar40,(cpi->common).height != iVar21);
    }
  }
  frame_over_shoot_limit = 0;
  bottom_index_1 = 0;
  top_index = 0;
  uVar40 = (undefined7)((ulong)unaff_R15 >> 8);
  if (cpi->ppi->use_svc == 0) {
    uVar20 = (uint)CONCAT71(uVar40,1);
  }
  else {
    iVar19 = (cpi->svc).spatial_layer_id;
    uVar20 = (uint)CONCAT71(uVar40,(cpi->svc).downsample_filter_type[iVar19]);
    iVar52 = (cpi->svc).downsample_filter_phase[iVar19];
  }
  pAVar1 = &cpi->common;
  pYVar26 = cpi->unscaled_source;
  if (((((((cpi->rc).postencode_drop != 0) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
        (cpi->ppi->lap_enabled == 0)) &&
       ((((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) &&
        (((cpi->oxcf).rc_cfg.mode == AOM_CBR &&
         ((0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark && ((cpi->rc).rtc_external_ratectrl == 0)))
         ))))) && (((pAVar1->current_frame).frame_type & 0xfd) != 0)) &&
     ((cpi->svc).spatial_layer_id == 0)) {
    av1_save_all_coding_context(cpi);
  }
  lVar22 = 0x41f08;
  do {
    piVar3 = (int32_t *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[0] + lVar22);
    piVar3[0] = 0;
    piVar3[1] = 0x10000;
    *(undefined8 *)(piVar3 + 2) = 0;
    piVar3 = (int32_t *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar22);
    piVar3[0] = 0;
    piVar3[1] = 0;
    piVar3[2] = 0x10000;
    piVar3[3] = 0;
    *(undefined4 *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[1] + lVar22) = 0;
    lVar22 = lVar22 + 0x24;
  } while (lVar22 != 0x42004);
  (cpi->gm_info).search_done = false;
  av1_set_speed_features_framesize_independent(cpi,cpi->speed);
  av1_set_rd_speed_thresholds(cpi);
  (cpi->common).features.interp_filter = MULTITAP_SHARP2;
  (cpi->common).features.switchable_motion_mode =
       (bool)((cpi->oxcf).motion_mode_cfg.enable_obmc | (cpi->common).features.allow_warped_motion);
  av1_setup_frame_size(cpi);
  uVar31 = (cpi->common).features.primary_ref_frame;
  if (((uVar31 & 0xf8) == 0 && uVar31 != 7) &&
     (lVar22 = (long)(cpi->common).remapped_ref_idx[uVar31 & 7], lVar22 != -1)) {
    pRVar29 = (cpi->common).ref_frame_map[lVar22];
  }
  else {
    pRVar29 = (RefCntBuffer *)0x0;
  }
  (cpi->common).prev_frame = pRVar29;
  av1_set_size_dependent_vars(cpi,&top_index,&bottom_index_1,&frame_over_shoot_limit);
  av1_set_mv_search_params(cpi);
  if (((cpi->common).current_frame.frame_number == 0) &&
     (((cpi->ppi->use_svc != 0 || (0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark)) &&
      ((cpi->svc).temporal_layer_id == 0)))) {
    pSVar46 = (cpi->common).seq_params;
    iVar19 = aom_alloc_frame_buffer
                       (&(cpi->svc).source_last_TL0,(cpi->oxcf).frm_dim_cfg.width,
                        (cpi->oxcf).frm_dim_cfg.height,pSVar46->subsampling_x,pSVar46->subsampling_y
                        ,(uint)pSVar46->use_highbitdepth,(cpi->oxcf).border_in_pixels,
                        (cpi->common).features.byte_alignment,false,0);
    if (iVar19 != 0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buffer for source_last_TL0");
    }
  }
  local_170 = (SequenceHeader *)CONCAT44(local_170._4_4_,uVar38);
  if (cpi->ppi->use_svc == 0) {
    iVar19 = (cpi->common).width;
    iVar21 = (pYVar26->field_2).field_0.y_crop_width;
    if ((iVar19 * 2 == iVar21) &&
       (iVar52 = (cpi->common).height, iVar52 * 2 == (pYVar26->field_3).field_0.y_crop_height)) {
      uVar20 = CONCAT31((int3)((uint)iVar19 >> 8),(0xe100 < iVar52 * iVar19) * '\x02' + '\x01');
    }
    else {
      iVar19 = iVar19 * 4;
      if ((iVar19 != iVar21) ||
         ((cpi->common).height << 2 != (pYVar26->field_3).field_0.y_crop_height)) {
        iVar52 = 8;
        if (iVar19 == iVar21 * 3) {
          uVar20 = uVar20 & 0xff;
          if ((cpi->common).height << 2 == (pYVar26->field_3).field_0.y_crop_height * 3) {
            uVar20 = 0;
          }
        }
        goto LAB_001c3aab;
      }
      uVar20 = (uint)CONCAT71((uint7)(uint3)((uint)iVar19 >> 8),1);
    }
    iVar52 = 8;
  }
LAB_001c3aab:
  local_168 = (AV1_COMMON *)CONCAT44(local_168._4_4_,uVar20);
  if (((((pAVar1->current_frame).frame_type & 0xfd) == 0) &&
      ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
     (((cpi->sf).part_sf.partition_search_type == '\0' &&
      (((cpi->sf).intra_sf.intra_pruning_with_hog != 0 ||
       ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))))) {
    pPVar23 = (cpi->td).pixel_gradient_info;
    if (pPVar23 == (PixelLevelGradientInfo *)0x0) {
      pPVar23 = (PixelLevelGradientInfo *)
                aom_malloc((ulong)(uint)((int)(2L >> (((cpi->common).seq_params)->monochrome & 0x3f)
                                              ) << 0x10));
      if (pPVar23 == (PixelLevelGradientInfo *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pixel_gradient_info");
      }
      (cpi->td).pixel_gradient_info = pPVar23;
    }
    (cpi->td).mb.pixel_gradient_info = pPVar23;
  }
  if (((cpi->oxcf).mode == '\x02') &&
     (((cpi->sf).part_sf.partition_search_type == '\0' ||
      ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
       (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0))))
      )))) {
    pBVar24 = (cpi->td).src_var_info_of_4x4_sub_blocks;
    if (pBVar24 == (Block4x4VarInfo *)0x0) {
      BVar4 = ((cpi->common).seq_params)->sb_size;
      pBVar24 = (Block4x4VarInfo *)
                aom_malloc((ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                         [BVar4] *
                                   (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [BVar4] * 0x10));
      if (pBVar24 == (Block4x4VarInfo *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate source_variance_info");
      }
      (cpi->td).src_var_info_of_4x4_sub_blocks = pBVar24;
    }
    (cpi->td).mb.src_var_info_of_4x4_sub_blocks = pBVar24;
  }
  if ((cpi->sf).part_sf.partition_search_type == '\x02') {
    BVar4 = ((cpi->common).seq_params)->sb_size;
    iVar19 = (uint)(BVar4 != BLOCK_64X64) * 3 + 1;
    pVVar25 = (cpi->td).vt64x64;
    if (pVVar25 != (VP64x64 *)0x0) {
      if (iVar19 == (cpi->td).num_64x64_blocks) goto LAB_001c3c74;
      aom_free(pVVar25);
      (cpi->td).vt64x64 = (VP64x64 *)0x0;
    }
    sVar43 = 0x2aa40;
    if (BVar4 == BLOCK_64X64) {
      sVar43 = 0xaa90;
    }
    pVVar25 = (VP64x64 *)aom_malloc(sVar43);
    (cpi->td).vt64x64 = pVVar25;
    if (pVVar25 == (VP64x64 *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->td.vt64x64");
    }
    (cpi->td).num_64x64_blocks = iVar19;
  }
LAB_001c3c74:
  if (((pAVar1->current_frame).frame_type == '\0') ||
     (((cpi->sf).inter_sf.extra_prune_warped != 0 && ((cpi->refresh_frame).golden_frame == true))))
  {
    pAVar9 = cpi->ppi;
    if ((cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats != 0) {
      memcpy((pAVar9->frame_probs).tx_type_probs,default_tx_type_probs,0x2140);
    }
    if (0x80000001 < (cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U) {
      memcpy(&pAVar9->frame_probs,default_obmc_probs,0x268);
    }
    if (0 < (cpi->sf).inter_sf.prune_warped_prob_thresh) {
      (pAVar9->frame_probs).warped_probs[3] = 0x40;
      (pAVar9->frame_probs).warped_probs[4] = 0x40;
      (pAVar9->frame_probs).warped_probs[5] = 0x40;
      (pAVar9->frame_probs).warped_probs[6] = 0x40;
      (pAVar9->frame_probs).warped_probs[0] = 0x40;
      (pAVar9->frame_probs).warped_probs[1] = 0x40;
      (pAVar9->frame_probs).warped_probs[2] = 0x40;
      (pAVar9->frame_probs).warped_probs[3] = 0x40;
    }
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
      memcpy((pAVar9->frame_probs).switchable_interp_probs,default_switchable_interp_probs,0x540);
    }
  }
  scaled = &cpi->scaled_source;
  filter = (InterpFilter)local_168;
  uVar20 = (uint)(InterpFilter)local_168;
  pYVar26 = av1_realloc_and_scale_if_required
                      (pAVar1,pYVar26,scaled,(InterpFilter)local_168,iVar52,true,false,
                       (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
  cpi->source = pYVar26;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0 || ((ulong)local_170 & 1) != 0) {
    local_168 = (AV1_COMMON *)CONCAT44(local_168._4_4_,uVar20);
    iVar19 = (cpi->common).mi_params.mi_cols * (cpi->common).mi_params.mi_rows >> 2;
    memblk = cpi->consec_zero_mv;
    if (memblk == (uint8_t *)0x0) {
      memblk = (uint8_t *)0x0;
    }
    else if (cpi->consec_zero_mv_alloc_size < iVar19) {
      aom_free(memblk);
      cpi->consec_zero_mv_alloc_size = 0;
      memblk = (uint8_t *)aom_malloc((long)iVar19);
      cpi->consec_zero_mv = memblk;
      if (memblk == (uint8_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->consec_zero_mv");
        memblk = cpi->consec_zero_mv;
      }
      cpi->consec_zero_mv_alloc_size = iVar19;
    }
    memset(memblk,0,(long)iVar19);
    filter = (InterpFilter)local_168;
  }
  if (cpi->scaled_last_source_available == 0) {
    if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
      pYVar26 = av1_realloc_and_scale_if_required
                          (pAVar1,cpi->unscaled_last_source,&cpi->scaled_last_source,filter,iVar52,
                           true,false,(cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->last_source = pYVar26;
    }
  }
  else {
    cpi->last_source = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 0;
  }
  if ((cpi->sf).rt_sf.use_temporal_noise_estimate != 0) {
    av1_update_noise_estimate(cpi);
  }
  if ((cpi->svc).number_spatial_layers == 1) {
    uVar20 = cpi->ref_frame_flags;
    if (((uVar20 & 8) != 0 && (cpi->oxcf).superres_cfg.enable_superres == false) &&
       ((((lVar22 = (long)(cpi->common).remapped_ref_idx[3], lVar22 == -1 ||
          (pRVar29 = (cpi->common).ref_frame_map[lVar22], pRVar29 == (RefCntBuffer *)0x0)) ||
         ((pRVar29->buf).field_2.field_0.y_crop_width != (cpi->common).width)) ||
        ((pRVar29->buf).field_3.field_0.y_crop_height != (cpi->common).height)))) {
      uVar20 = uVar20 & 0xfffffff7;
      cpi->ref_frame_flags = uVar20;
    }
    if (((uVar20 & 0x40) != 0) &&
       (((lVar22 = (long)(cpi->common).remapped_ref_idx[6], lVar22 == -1 ||
         (pRVar29 = (cpi->common).ref_frame_map[lVar22], pRVar29 == (RefCntBuffer *)0x0)) ||
        (((pRVar29->buf).field_2.field_0.y_crop_width != (cpi->common).width ||
         ((pRVar29->buf).field_3.field_0.y_crop_height != (cpi->common).height)))))) {
      cpi->ref_frame_flags = uVar20 & 0xffffffbf;
    }
  }
  if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
     (((pAVar1->current_frame).frame_type & 0xfd) != 0)) {
    av1_scale_references(cpi,filter,iVar52,1);
  }
  av1_set_quantizer(pAVar1,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,top_index,
                    (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                    (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                    (cpi->oxcf).tune_cfg.tuning);
  av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
  quant_params = &(cpi->common).quant_params;
  av1_init_quantizer(&cpi->enc_quant_dequant_params,quant_params,
                     ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
  av1_set_variance_partition_thresholds(cpi,top_index,0);
  av1_setup_frame(cpi);
  if ((((cpi->sf).rt_sf.overshoot_detection_cbr == '\x01') && ((cpi->rc).high_source_sad != 0)) &&
     (iVar19 = av1_encodedframe_overshoot_cbr(cpi,&top_index), iVar19 != 0)) {
    av1_set_quantizer(pAVar1,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,top_index,
                      (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                      (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                      (cpi->oxcf).tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
    av1_init_quantizer(&cpi->enc_quant_dequant_params,quant_params,
                       ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
    av1_set_variance_partition_thresholds(cpi,top_index,0);
    if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
        ((cpi->common).features.error_resilient_mode != false)) ||
       ((cpi->common).features.primary_ref_frame == 7)) {
      av1_setup_frame(cpi);
    }
  }
  av1_apply_active_map(cpi);
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    av1_cyclic_refresh_setup(cpi);
  }
  psVar2 = &(cpi->common).seg;
  if ((cpi->common).seg.enabled == '\0') {
    memset(psVar2,0,0xac);
  }
  else if (((cpi->common).seg.update_data == '\0') &&
          (pRVar29 = (cpi->common).prev_frame, pRVar29 != (RefCntBuffer *)0x0)) {
    paiVar33 = (pRVar29->seg).feature_data;
    paiVar34 = (cpi->common).seg.feature_data;
    lVar22 = 0;
    do {
      (cpi->common).seg.feature_mask[lVar22] = (pRVar29->seg).feature_mask[lVar22];
      lVar44 = 0;
      do {
        (*paiVar34)[lVar44] = (*paiVar33)[lVar44];
        lVar44 = lVar44 + 1;
      } while (lVar44 != 8);
      lVar22 = lVar22 + 1;
      paiVar34 = paiVar34 + 1;
      paiVar33 = paiVar33 + 1;
    } while (lVar22 != 8);
    (cpi->common).seg.segid_preskip = (pRVar29->seg).segid_preskip;
    (cpi->common).seg.last_active_segid = (pRVar29->seg).last_active_segid;
    (cpi->common).seg.enabled = (pRVar29->seg).enabled;
  }
  else {
    av1_calculate_segdata(psVar2);
  }
  pRVar29 = (cpi->common).cur_frame;
  paiVar34 = (cpi->common).seg.feature_data;
  paiVar33 = (pRVar29->seg).feature_data;
  lVar22 = 0;
  do {
    (pRVar29->seg).feature_mask[lVar22] = (cpi->common).seg.feature_mask[lVar22];
    lVar44 = 0;
    do {
      (*paiVar33)[lVar44] = (*paiVar34)[lVar44];
      lVar44 = lVar44 + 1;
    } while (lVar44 != 8);
    lVar22 = lVar22 + 1;
    paiVar33 = paiVar33 + 1;
    paiVar34 = paiVar34 + 1;
  } while (lVar22 != 8);
  (pRVar29->seg).segid_preskip = (cpi->common).seg.segid_preskip;
  (pRVar29->seg).last_active_segid = (cpi->common).seg.last_active_segid;
  (pRVar29->seg).enabled = (cpi->common).seg.enabled;
  if (((((cpi->ppi->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
       (cpi->compressor_stage != '\x01')) &&
      (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))) &&
     ((cpi->sf).rt_sf.use_rtc_tf != 0)) {
    pSVar46 = (cpi->common).seq_params;
    pYVar26 = &cpi->orig_source;
    if ((cpi->orig_source).buffer_alloc_sz == 0) {
      iVar19 = (cpi->oxcf).frm_dim_cfg.width;
LAB_001c431e:
      iVar19 = aom_alloc_frame_buffer
                         (pYVar26,iVar19,(cpi->oxcf).frm_dim_cfg.height,pSVar46->subsampling_x,
                          pSVar46->subsampling_y,(uint)pSVar46->use_highbitdepth,
                          (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,false,0
                         );
      if (iVar19 != 0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate scaled buffer");
      }
    }
    else {
      iVar52 = (cpi->rc).prev_coded_width;
      iVar19 = (cpi->oxcf).frm_dim_cfg.width;
      if ((iVar52 != iVar19) ||
         (iVar19 = iVar52, (cpi->rc).prev_coded_height != (cpi->oxcf).frm_dim_cfg.height))
      goto LAB_001c431e;
    }
    aom_yv12_copy_y_c(cpi->source,pYVar26,1);
    aom_yv12_copy_u_c(cpi->source,pYVar26,1);
    aom_yv12_copy_v_c(cpi->source,pYVar26,1);
  }
  if (((pAVar1->current_frame).frame_type & 0xfd) != 0) {
    av1_pick_and_set_high_precision_mv(cpi,top_index);
  }
  av1_encode_frame(cpi);
  iVar19 = (cpi->rc).rtc_external_ratectrl;
  bVar49 = (cpi->common).current_frame.frame_type;
  if (iVar19 == 0) {
    if ((bVar49 & 0xfd) == 0) goto LAB_001c462b;
    iVar21 = ((cpi->rc).cnt_zeromv * 100) /
             ((cpi->common).mi_params.mi_cols * (cpi->common).mi_params.mi_rows);
    iVar52 = cpi->ppi->use_svc;
    if ((iVar52 == 0) ||
       (((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0 &&
        ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))) {
      iVar58 = (cpi->rc).avg_frame_low_motion;
      if (iVar58 != 0) {
        iVar58 = iVar58 * 3;
        iVar42 = iVar58 + iVar21;
        iVar21 = iVar21 + 3 + iVar58;
        if (-1 < iVar42) {
          iVar21 = iVar42;
        }
        iVar21 = iVar21 >> 2;
      }
      (cpi->rc).avg_frame_low_motion = iVar21;
      auVar50 = _DAT_004cd030;
      if ((iVar52 != 0) &&
         (uVar20 = (cpi->svc).spatial_layer_id, iVar52 = (cpi->svc).number_spatial_layers,
         1 < iVar52 && uVar20 == iVar52 - 1U)) {
        lVar44 = (long)(cpi->svc).number_temporal_layers;
        pLVar12 = (cpi->svc).layer_context;
        uVar41 = (ulong)uVar20 + 3 & 0xfffffffffffffffc;
        lVar22 = (ulong)uVar20 - 1;
        auVar51._8_4_ = (int)lVar22;
        auVar51._0_8_ = lVar22;
        auVar51._12_4_ = (int)((ulong)lVar22 >> 0x20);
        lVar22 = (long)(cpi->svc).temporal_layer_id * 0x3380 + 0xd8;
        auVar51 = auVar51 ^ _DAT_004cd030;
        auVar54 = _DAT_004d5360;
        auVar56 = _DAT_004cd020;
        do {
          auVar57 = auVar56 ^ auVar50;
          iVar52 = auVar51._4_4_;
          if ((bool)(~(auVar57._4_4_ == iVar52 && auVar51._0_4_ < auVar57._0_4_ ||
                      iVar52 < auVar57._4_4_) & 1)) {
            *(int *)((long)&(pLVar12->rc).base_frame_target + lVar22) = iVar21;
          }
          if ((auVar57._12_4_ != auVar51._12_4_ || auVar57._8_4_ <= auVar51._8_4_) &&
              auVar57._12_4_ <= auVar51._12_4_) {
            *(int *)((long)&pLVar12[lVar44].rc.base_frame_target + lVar22) = iVar21;
          }
          auVar57 = auVar54 ^ auVar50;
          iVar58 = auVar57._4_4_;
          if (iVar58 <= iVar52 && (iVar58 != iVar52 || auVar57._0_4_ <= auVar51._0_4_)) {
            *(int *)((long)&pLVar12[lVar44 * 2].rc.base_frame_target + lVar22) = iVar21;
            *(int *)((long)&pLVar12[lVar44 * 3].rc.base_frame_target + lVar22) = iVar21;
          }
          lVar36 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + 4;
          auVar56._8_8_ = lVar36 + 4;
          lVar36 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + 4;
          auVar54._8_8_ = lVar36 + 4;
          lVar22 = lVar22 + lVar44 * 0xce00;
          uVar41 = uVar41 - 4;
        } while (uVar41 != 0);
      }
    }
  }
  else if ((bVar49 & 0xfd) == 0) goto LAB_001c462b;
  if (((((((cpi->oxcf).rc_cfg.mode == AOM_CBR) && ((cpi->oxcf).mode == '\x01')) &&
        ((cpi->svc).number_spatial_layers == 1)) &&
       ((iVar19 == 0 && ((cpi->svc).number_temporal_layers == 1)))) &&
      ((cpi->ppi->rtc_ref).set_ref_frame_config == 0)) &&
     ((cpi->sf).rt_sf.gf_refresh_based_on_qp != 0)) {
    av1_adjust_gf_refresh_qp_one_pass_rt(cpi);
  }
LAB_001c462b:
  if ((((1 < (cpi->common).current_frame.frame_number) && (cpi->ppi->use_svc == 0)) &&
      (((cpi->scaled_source).field_5.field_0.y_buffer != (uint8_t *)0x0 &&
       ((((cpi->scaled_last_source).field_5.field_0.y_buffer != (uint8_t *)0x0 &&
         ((cpi->scaled_source).field_2.field_0.y_crop_width ==
          (cpi->scaled_last_source).field_2.field_0.y_crop_width)) &&
        ((cpi->scaled_source).field_3.field_0.y_crop_height ==
         (cpi->scaled_last_source).field_3.field_0.y_crop_height)))))) &&
     (((cpi->common).width != (cpi->unscaled_source->field_2).field_0.y_crop_width ||
      ((cpi->common).height != (cpi->unscaled_source->field_3).field_0.y_crop_height)))) {
    pYVar26 = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 1;
    aom_yv12_copy_y_c(scaled,pYVar26,1);
    aom_yv12_copy_u_c(scaled,pYVar26,1);
    aom_yv12_copy_v_c(scaled,pYVar26,1);
  }
LAB_001c4644:
  pSVar46 = (cpi->common).seq_params;
  if (((cpi->ppi->p_rc).next_key_frame_forced != 0) && ((cpi->rc).frames_to_key == 1)) {
    pYVar26 = &((cpi->common).cur_frame)->buf;
    if (pSVar46->use_highbitdepth == '\0') {
      iVar30 = aom_get_y_sse(cpi->source,pYVar26);
    }
    else {
      iVar30 = aom_highbd_get_y_sse(cpi->source,pYVar26);
    }
    cpi->ambient_err = iVar30;
  }
  pRVar29 = (cpi->common).cur_frame;
  aVar14 = pSVar46->transfer_characteristics;
  (pRVar29->buf).color_primaries = pSVar46->color_primaries;
  (pRVar29->buf).transfer_characteristics = aVar14;
  (pRVar29->buf).matrix_coefficients = pSVar46->matrix_coefficients;
  (pRVar29->buf).monochrome = pSVar46->monochrome;
  (pRVar29->buf).chroma_sample_position = pSVar46->chroma_sample_position;
  (pRVar29->buf).color_range = pSVar46->color_range;
  iVar19 = (cpi->common).render_height;
  (pRVar29->buf).render_width = (cpi->common).render_width;
  (pRVar29->buf).render_height = iVar19;
  iVar19 = (cpi->mt_info).pipeline_lpf_mt_with_enc;
  if (iVar19 == 0) {
    (cpi->common).lf.filter_level[0] = 0;
    (cpi->common).lf.filter_level[1] = 0;
    (cpi->common).lf.backup_filter_level[0] = 0;
    (cpi->common).lf.backup_filter_level[1] = 0;
    (cpi->common).cdef_info.cdef_bits = 0;
    (cpi->common).cdef_info.nb_cdef_strengths = 1;
    (cpi->common).cdef_info.cdef_strengths[0] = 0;
    (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
    (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
    (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
    (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
  }
  local_168 = &cpi->common;
  if ((cpi->common).features.allow_intrabc == false) {
    iVar52 = (cpi->mt_info).num_mod_workers[5];
    pSVar27 = (cpi->common).seq_params;
    uVar8 = pSVar27->monochrome;
    (cpi->td).mb.rdmult = (cpi->rd).RDMULT;
    bVar48 = true;
    if ((cpi->common).features.coded_lossless == false) {
      uVar20 = (cpi->common).tiles.large_scale;
      bVar47 = iVar19 == 0 && uVar20 == 0;
      bVar37 = uVar20 != 0 || pSVar27->enable_cdef == '\0';
    }
    else {
      bVar47 = false;
      bVar37 = true;
    }
    if ((pSVar27->enable_restoration != '\0') && ((cpi->common).features.all_lossless == false)) {
      bVar48 = (cpi->common).tiles.large_scale != 0;
    }
    bVar49 = 0xc;
    if (((cpi->ppi->rtc_ref).non_reference_frame == 0) &&
       (bVar49 = 0, (cpi->oxcf).algo_cfg.skip_postproc_filtering == true)) {
      bVar49 = cpi->ppi->b_calculate_psnr == 0;
      if ((!(bool)(~bVar48 & 1U | !(bool)bVar49)) &&
         (bVar49 = 2, (cpi->common).width == (cpi->common).superres_upscaled_width)) {
        if (bVar37) {
          bVar49 = bVar47 << 3;
        }
        else {
          bVar49 = 4;
          if (bVar47 != false) {
            bVar49 = ((cpi->sf).lpf_sf.cdef_pick_method == CDEF_PICK_FROM_Q) * '\b' + 4;
          }
        }
      }
    }
    xd = &(cpi->td).mb.e_mbd;
    if (bVar47 != false) {
      local_14c = CONCAT31(local_14c._1_3_,uVar8 == '\0');
      local_170 = pSVar46;
      av1_pick_filter_level(cpi->source,cpi,(cpi->sf).lpf_sf.lpf_pick);
      pSVar46 = local_170;
      if ((((cpi->common).lf.filter_level[0] != 0) || ((cpi->common).lf.filter_level[1] != 0)) &&
         (bVar49 < 8)) {
        iVar19 = 0;
        if ((0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect) &&
           (0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr)) {
          iVar19 = ((cpi->sf).lpf_sf.lpf_pick == '\x03') + 1;
        }
        av1_loop_filter_frame_mt
                  (&((cpi->common).cur_frame)->buf,local_168,xd,0,(local_14c & 0xff) * 2 + 1,0,
                   (cpi->mt_info).workers,iVar52,&(cpi->mt_info).lf_row_sync,iVar19);
      }
    }
    if (!bVar48) {
      av1_loop_restoration_save_boundary_lines(&((cpi->common).cur_frame)->buf,local_168,0);
    }
    if (!bVar37) {
      iVar19 = (cpi->mt_info).num_mod_workers[7];
      av1_cdef_search(cpi);
      if ((bVar49 & 4) == 0) {
        if (iVar19 < 2) {
          av1_cdef_frame(&((cpi->common).cur_frame)->buf,local_168,xd,av1_cdef_init_fb_row);
        }
        else {
          uVar20 = 0;
          uVar31 = 0;
          if ((((1 < (cpi->mt_info).num_mod_workers[7]) &&
               (pSVar27 = (cpi->common).seq_params, pSVar27->enable_cdef != '\0')) &&
              (((cpi->common).features.coded_lossless == false &&
               ((uVar20 = uVar31, (cpi->common).tiles.large_scale == 0 &&
                ((cpi->ppi->rtc_ref).non_reference_frame == 0)))))) &&
             ((pSVar27->enable_restoration == '\0' || ((cpi->common).features.all_lossless == true))
             )) {
            uVar20 = (uint)((cpi->common).width == (cpi->common).superres_upscaled_width);
          }
          av1_cdef_frame_mt(local_168,xd,(cpi->mt_info).cdef_worker,(cpi->mt_info).workers,
                            &(cpi->mt_info).cdef_sync,iVar19,av1_cdef_init_fb_row_mt,uVar20);
        }
      }
    }
    if (((bVar49 & 2) == 0) && ((cpi->common).width != (cpi->common).superres_upscaled_width)) {
      av1_superres_post_encode(cpi);
    }
    if (!bVar48) {
      iVar19 = (cpi->mt_info).num_mod_workers[8];
      av1_loop_restoration_save_boundary_lines(&((cpi->common).cur_frame)->buf,local_168,1);
      av1_pick_filter_restoration(cpi->source,cpi);
      if (((bVar49 & 1) == 0) &&
         ((((cpi->common).rst_info[0].frame_restoration_type != RESTORE_NONE ||
           ((cpi->common).rst_info[1].frame_restoration_type != RESTORE_NONE)) ||
          ((cpi->common).rst_info[2].frame_restoration_type != RESTORE_NONE)))) {
        pYVar26 = &((cpi->common).cur_frame)->buf;
        if (iVar19 < 2) {
          av1_loop_restoration_filter_frame(pYVar26,local_168,0,&cpi->lr_ctxt);
        }
        else {
          av1_loop_restoration_filter_frame_mt
                    (pYVar26,local_168,0,(cpi->mt_info).workers,iVar19,&(cpi->mt_info).lr_row_sync,
                     &cpi->lr_ctxt,1);
        }
      }
    }
  }
  if (((cpi->oxcf).mode != '\x02') && ((cpi->ppi->rtc_ref).non_reference_frame == 0)) {
    pRVar45 = (cpi->common).rst_info;
    uVar41 = 0;
    do {
      if ((((((cpi->mt_info).num_mod_workers[7] < 2) ||
            (pSVar27 = (cpi->common).seq_params, pSVar27->enable_cdef == '\0')) ||
           (((cpi->common).features.coded_lossless != false ||
            (((cpi->common).tiles.large_scale != 0 || ((cpi->ppi->rtc_ref).non_reference_frame != 0)
             ))))) ||
          (((pSVar27->enable_restoration != '\0' && ((cpi->common).features.all_lossless != true))
           || ((cpi->common).width != (cpi->common).superres_upscaled_width)))) &&
         (((((cpi->mt_info).num_mod_workers[8] < 2 ||
            (pSVar27 = (cpi->common).seq_params, pSVar27->enable_restoration == '\0')) ||
           ((cpi->common).features.all_lossless != false)) ||
          (((cpi->common).tiles.large_scale != 0 ||
           (pRVar45->frame_restoration_type == RESTORE_NONE)))))) {
        pRVar29 = (cpi->common).cur_frame;
        aom_extend_frame_borders_plane_row_c
                  (&pRVar29->buf,(int)uVar41,0,
                   *(int *)((long)(pRVar29->buf).store_buf_adr + (ulong)(uVar41 != 0) * 4 + -0x30));
        pSVar27 = (cpi->common).seq_params;
      }
      if (pSVar27->monochrome != '\0') break;
      pRVar45 = pRVar45 + 1;
      bVar48 = uVar41 < 2;
      uVar41 = uVar41 + 1;
    } while (bVar48);
  }
  psVar39 = local_138;
  if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_FILM) {
    (cpi->common).film_grain_params.apply_grain = 1;
    (cpi->common).film_grain_params.update_parameters = 1;
    iVar19 = rand();
    (cpi->common).film_grain_params.random_seed = (uint16_t)iVar19;
    (cpi->common).film_grain_params.num_y_points = 1;
    (cpi->common).film_grain_params.scaling_points_y[0] = (int  [2])0x6400000080;
    bVar48 = ((cpi->common).seq_params)->monochrome == '\0';
    if (bVar48) {
      (cpi->common).film_grain_params.scaling_points_cb[0] = (int  [2])0x6400000080;
      (cpi->common).film_grain_params.scaling_points_cr[0] = (int  [2])0x6400000080;
    }
    uVar20 = (uint)bVar48;
    (cpi->common).film_grain_params.num_cb_points = uVar20;
    (cpi->common).film_grain_params.num_cr_points = uVar20;
    (cpi->common).film_grain_params.chroma_scaling_from_luma = 0;
    (cpi->common).film_grain_params.grain_scale_shift = 0;
    (cpi->common).film_grain_params.scaling_shift = 1;
    (cpi->common).film_grain_params.ar_coeff_lag = 0;
    (cpi->common).film_grain_params.ar_coeff_shift = 1;
    (cpi->common).film_grain_params.overlap_flag = 1;
  }
  av1_finalize_encoded_frame(cpi);
  (cpi->rc).coefficient_size = 0;
  iVar19 = av1_pack_bitstream(cpi,local_118,local_110,psVar39,largest_tile_id);
  iVar52 = 1;
  if (iVar19 == 0) {
    if (((((cpi->rc).postencode_drop != 0) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
        (((cpi->ppi->lap_enabled == 0 &&
          ((((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) &&
           ((cpi->oxcf).rc_cfg.mode == AOM_CBR)))) &&
         (((0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark && ((cpi->rc).rtc_external_ratectrl == 0))
          && (((local_168->current_frame).frame_type & 0xfd) != 0)))))) &&
       (((cpi->svc).spatial_layer_id == 0 &&
        (iVar19 = av1_postencode_drop_cbr(cpi,psVar39), iVar19 != 0)))) {
      return 0;
    }
    plVar16 = local_120;
    piVar15 = local_128;
    if (local_128 != (int64_t *)0x0) {
      pYVar26 = &((cpi->common).cur_frame)->buf;
      if (pSVar46->use_highbitdepth == '\0') {
        iVar30 = aom_get_y_sse(cpi->source,pYVar26);
      }
      else {
        iVar30 = aom_highbd_get_y_sse(cpi->source,pYVar26);
      }
      *piVar15 = iVar30;
    }
    if (plVar16 != (long *)0x0) {
      *plVar16 = *psVar39 << 8;
    }
    iVar52 = 0;
    if (cpi->use_ducky_encode != 0) {
      aom_calc_psnr(cpi->source,&((cpi->common).cur_frame)->buf,
                    (PSNR_STATS *)&frame_over_shoot_limit);
      (cpi->ducky_encode_info).frame_result.global_order_idx =
           ((cpi->common).cur_frame)->display_order_hint;
      (cpi->ducky_encode_info).frame_result.q_index = (cpi->common).quant_params.base_qindex;
      (cpi->ducky_encode_info).frame_result.rdmult = (cpi->rd).RDMULT;
      (cpi->ducky_encode_info).frame_result.rate = (int)*psVar39 << 3;
      (cpi->ducky_encode_info).frame_result.dist = local_b0;
      (cpi->ducky_encode_info).frame_result.psnr =
           (double)CONCAT44(uStack_cc,frame_over_shoot_limit);
    }
  }
  return iVar52;
}

Assistant:

static int encode_with_recode_loop_and_filter(AV1_COMP *cpi, size_t *size,
                                              uint8_t *dest, size_t dest_size,
                                              int64_t *sse, int64_t *rate,
                                              int *largest_tile_id) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_with_or_without_recode_time);
#endif
  for (int i = 0; i < NUM_RECODES_PER_FRAME; i++) {
    cpi->do_update_frame_probs_txtype[i] = 0;
    cpi->do_update_frame_probs_obmc[i] = 0;
    cpi->do_update_frame_probs_warp[i] = 0;
    cpi->do_update_frame_probs_interpfilter[i] = 0;
  }

  cpi->do_update_vbr_bits_off_target_fast = 0;
  int err;
#if CONFIG_REALTIME_ONLY
  err = encode_without_recode(cpi);
#else
  if (cpi->sf.hl_sf.recode_loop == DISALLOW_RECODE)
    err = encode_without_recode(cpi);
  else
    err = encode_with_recode_loop(cpi, size, dest, dest_size);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_with_or_without_recode_time);
#endif
  if (err != AOM_CODEC_OK) {
    if (err == -1) {
      // special case as described in encode_with_recode_loop().
      // Encoding was skipped.
      err = AOM_CODEC_OK;
      if (sse != NULL) *sse = INT64_MAX;
      if (rate != NULL) *rate = INT64_MAX;
      *largest_tile_id = 0;
    }
    return err;
  }

#ifdef OUTPUT_YUV_DENOISED
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  if (oxcf->noise_sensitivity > 0 && denoise_svc(cpi)) {
    aom_write_yuv_frame(yuv_denoised_file,
                        &cpi->denoiser.running_avg_y[INTRA_FRAME]);
  }
#endif

  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;

  // Special case code to reduce pulsing when key frames are forced at a
  // fixed interval. Note the reconstruction error if it is the frame before
  // the force key frame
  if (cpi->ppi->p_rc.next_key_frame_forced && cpi->rc.frames_to_key == 1) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (seq_params->use_highbitdepth) {
      cpi->ambient_err = aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf);
    } else {
      cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
    }
#else
    cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }

  cm->cur_frame->buf.color_primaries = seq_params->color_primaries;
  cm->cur_frame->buf.transfer_characteristics =
      seq_params->transfer_characteristics;
  cm->cur_frame->buf.matrix_coefficients = seq_params->matrix_coefficients;
  cm->cur_frame->buf.monochrome = seq_params->monochrome;
  cm->cur_frame->buf.chroma_sample_position =
      seq_params->chroma_sample_position;
  cm->cur_frame->buf.color_range = seq_params->color_range;
  cm->cur_frame->buf.render_width = cm->render_width;
  cm->cur_frame->buf.render_height = cm->render_height;

  if (!cpi->mt_info.pipeline_lpf_mt_with_enc)
    set_postproc_filter_default_params(&cpi->common);

  if (!cm->features.allow_intrabc) {
    loopfilter_frame(cpi, cm);
  }

  if (cpi->oxcf.mode != ALLINTRA && !cpi->ppi->rtc_ref.non_reference_frame) {
    extend_frame_borders(cpi);
  }

#ifdef OUTPUT_YUV_REC
  aom_write_one_yuv_frame(cm, &cm->cur_frame->buf);
#endif

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_FILM) {
    set_grain_syn_params(cm);
  }

  av1_finalize_encoded_frame(cpi);
  // Build the bitstream
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_pack_bitstream_final_time);
#endif
  cpi->rc.coefficient_size = 0;
  if (av1_pack_bitstream(cpi, dest, dest_size, size, largest_tile_id) !=
      AOM_CODEC_OK)
    return AOM_CODEC_ERROR;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_pack_bitstream_final_time);
#endif

  if (cpi->rc.postencode_drop && allow_postencode_drop_rtc(cpi) &&
      av1_postencode_drop_cbr(cpi, size)) {
    return AOM_CODEC_OK;
  }

  // Compute sse and rate.
  if (sse != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    *sse = (seq_params->use_highbitdepth)
               ? aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf)
               : aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#else
    *sse = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }
  if (rate != NULL) {
    const int64_t bits = (*size << 3);
    *rate = (bits << 5);  // To match scale.
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode) {
    PSNR_STATS psnr;
    aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
    DuckyEncodeFrameResult *frame_result = &cpi->ducky_encode_info.frame_result;
    frame_result->global_order_idx = cm->cur_frame->display_order_hint;
    frame_result->q_index = cm->quant_params.base_qindex;
    frame_result->rdmult = cpi->rd.RDMULT;
    frame_result->rate = (int)(*size) * 8;
    frame_result->dist = psnr.sse[0];
    frame_result->psnr = psnr.psnr[0];
  }
#endif  // !CONFIG_REALTIME_ONLY

  return AOM_CODEC_OK;
}